

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

MessageAnalysis __thiscall
google::protobuf::compiler::cpp::SCCAnalyzer::GetSCCAnalysis(SCCAnalyzer *this,SCC *scc)

{
  Descriptor *this_00;
  mapped_type mVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  FieldOptions_CType FVar5;
  MessageAnalysis MVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  size_type sVar10;
  const_reference ppDVar11;
  FieldDescriptor *this_01;
  FieldOptions *this_02;
  Descriptor *descriptor_00;
  SCC *scc_00;
  MessageAnalysis analysis;
  SCC *child;
  FieldDescriptor *field;
  int i_1;
  Descriptor *descriptor;
  int i;
  MessageAnalysis result;
  SCC *scc_local;
  SCCAnalyzer *this_local;
  
  _i = scc;
  sVar7 = std::
          map<const_google::protobuf::compiler::cpp::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::cpp::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::cpp::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
          ::count(&this->analysis_cache_,(key_type *)&i);
  if (sVar7 == 0) {
    memset((void *)((long)&descriptor + 4),0,4);
    for (descriptor._0_4_ = 0; uVar9 = (ulong)(int)descriptor,
        sVar10 = std::
                 vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::size(&_i->descriptors), uVar9 < sVar10; descriptor._0_4_ = (int)descriptor + 1) {
      ppDVar11 = std::
                 vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::operator[](&_i->descriptors,(long)(int)descriptor);
      this_00 = *ppDVar11;
      iVar3 = Descriptor::extension_range_count(this_00);
      if (0 < iVar3) {
        descriptor._4_3_ = CONCAT12(1,descriptor._4_2_);
      }
      for (field._4_4_ = 0; iVar3 = Descriptor::field_count(this_00), field._4_4_ < iVar3;
          field._4_4_ = field._4_4_ + 1) {
        this_01 = Descriptor::field(this_00,field._4_4_);
        bVar2 = FieldDescriptor::is_required(this_01);
        if (bVar2) {
          descriptor._4_4_ = (mapped_type)CONCAT13(true,descriptor._4_3_);
        }
        TVar4 = FieldDescriptor::type(this_01);
        if (TVar4 == TYPE_STRING) {
LAB_00375bf0:
          this_02 = FieldDescriptor::options(this_01);
          FVar5 = FieldOptions::ctype(this_02);
          if (FVar5 == FieldOptions_CType_CORD) {
            descriptor._4_2_ = CONCAT11(1,descriptor._4_1_);
          }
        }
        else if (TVar4 - TYPE_GROUP < 2) {
          descriptor_00 = FieldDescriptor::message_type(this_01);
          scc_00 = GetSCC(this,descriptor_00);
          if (scc_00 == _i) {
            descriptor._4_4_ = (mapped_type)CONCAT31(descriptor._5_3_,true);
          }
          else {
            MVar6 = GetSCCAnalysis(this,scc_00);
            mVar1 = descriptor._4_4_;
            descriptor._4_2_ =
                 CONCAT11(((uint)descriptor._4_4_ & 0x100) != 0 || ((uint)MVar6 & 0x100) != 0,
                          descriptor._4_1_);
            descriptor._7_1_ = mVar1.contains_required;
            descriptor._4_3_ =
                 CONCAT12(((uint)mVar1 & 0x10000) != 0 || ((uint)MVar6 & 0x10000) != 0,
                          descriptor._4_2_);
            bVar2 = ShouldIgnoreRequiredFieldCheck(this_01,&this->options_);
            if (!bVar2) {
              descriptor._4_4_ =
                   (mapped_type)
                   CONCAT13(((uint)descriptor._4_4_ & 0x1000000) != 0 ||
                            ((uint)MVar6 & 0x1000000) != 0,descriptor._4_3_);
            }
          }
        }
        else if (TVar4 == TYPE_BYTES) goto LAB_00375bf0;
      }
    }
    pmVar8 = std::
             map<const_google::protobuf::compiler::cpp::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::cpp::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::cpp::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
             ::operator[](&this->analysis_cache_,(key_type *)&i);
    *pmVar8 = descriptor._4_4_;
    this_local._4_1_ = pmVar8->is_recursive;
    this_local._5_1_ = pmVar8->contains_cord;
    this_local._6_1_ = pmVar8->contains_extension;
    this_local._7_1_ = pmVar8->contains_required;
  }
  else {
    pmVar8 = std::
             map<const_google::protobuf::compiler::cpp::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::cpp::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::cpp::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
             ::operator[](&this->analysis_cache_,(key_type *)&i);
    this_local._4_1_ = pmVar8->is_recursive;
    this_local._5_1_ = pmVar8->contains_cord;
    this_local._6_1_ = pmVar8->contains_extension;
    this_local._7_1_ = pmVar8->contains_required;
  }
  return this_local._4_4_;
}

Assistant:

MessageAnalysis SCCAnalyzer::GetSCCAnalysis(const SCC* scc) {
  if (analysis_cache_.count(scc)) return analysis_cache_[scc];
  MessageAnalysis result = MessageAnalysis();
  for (int i = 0; i < scc->descriptors.size(); i++) {
    const Descriptor* descriptor = scc->descriptors[i];
    if (descriptor->extension_range_count() > 0) {
      result.contains_extension = true;
    }
    for (int i = 0; i < descriptor->field_count(); i++) {
      const FieldDescriptor* field = descriptor->field(i);
      if (field->is_required()) {
        result.contains_required = true;
      }
      switch (field->type()) {
        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_BYTES: {
          if (field->options().ctype() == FieldOptions::CORD) {
            result.contains_cord = true;
          }
          break;
        }
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE: {
          const SCC* child = GetSCC(field->message_type());
          if (child != scc) {
            MessageAnalysis analysis = GetSCCAnalysis(child);
            result.contains_cord |= analysis.contains_cord;
            result.contains_extension |= analysis.contains_extension;
            if (!ShouldIgnoreRequiredFieldCheck(field, options_)) {
              result.contains_required |= analysis.contains_required;
            }
          } else {
            // This field points back into the same SCC hence the messages
            // in the SCC are recursive. Note if SCC contains more than two
            // nodes it has to be recursive, however this test also works for
            // a single node that is recursive.
            result.is_recursive = true;
          }
          break;
        }
        default:
          break;
      }
    }
  }
  // We deliberately only insert the result here. After we contracted the SCC
  // in the graph, the graph should be a DAG. Hence we shouldn't need to mark
  // nodes visited as we can never return to them. By inserting them here
  // we will go in an infinite loop if the SCC is not correct.
  return analysis_cache_[scc] = result;
}